

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c
# Opt level: O1

char * sx_strncpy(char *dst,int dst_sz,char *src,int _num)

{
  char cVar1;
  code *pcVar2;
  int iVar3;
  bool bVar4;
  int iVar5;
  char *pcVar6;
  uint uVar7;
  char *unaff_RBP;
  long lVar8;
  long lVar9;
  uint uVar10;
  int iVar11;
  uint uVar12;
  int var__a;
  
  if (dst == (char *)0x0) {
    sx__debug_message("/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/src/string.c",
                      0xd9,"dst");
    pcVar2 = (code *)swi(3);
    pcVar6 = (char *)(*pcVar2)();
    return pcVar6;
  }
  if (src == (char *)0x0) {
    sx__debug_message("/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/src/string.c",
                      0xda,"src");
    pcVar2 = (code *)swi(3);
    pcVar6 = (char *)(*pcVar2)();
    return pcVar6;
  }
  uVar10 = (uint)src;
  pcVar6 = src;
  if (((ulong)src & 7) == 0) {
LAB_0010756b:
    do {
      lVar9 = 0;
      do {
        lVar8 = lVar9;
        lVar9 = lVar8 + 8;
      } while ((~(0x101010101010100 - *(ulong *)(pcVar6 + lVar8) | *(ulong *)(pcVar6 + lVar8)) &
               0x8080808080808080) == 0);
      iVar5 = (int)pcVar6;
      iVar11 = (-8 - uVar10) + iVar5;
      iVar3 = (int)lVar9;
      if (_num < iVar3 + iVar11) {
        bVar4 = false;
        unaff_RBP = (char *)(ulong)(uint)_num;
      }
      else if ((pcVar6 + lVar9)[-8] == '\0') {
        uVar12 = iVar11 + iVar3;
        if (_num <= (int)uVar12) {
          uVar12 = _num;
        }
        bVar4 = false;
        unaff_RBP = (char *)(ulong)uVar12;
      }
      else {
        if (pcVar6[lVar8 + 1] == '\0') {
          iVar5 = iVar5 + (-7 - uVar10);
        }
        else if (pcVar6[lVar8 + 2] == '\0') {
          iVar5 = iVar5 + (-6 - uVar10);
        }
        else if (pcVar6[lVar8 + 3] == '\0') {
          iVar5 = iVar5 + (-5 - uVar10);
        }
        else if (pcVar6[lVar8 + 4] == '\0') {
          iVar5 = iVar5 + (-4 - uVar10);
        }
        else if (pcVar6[lVar8 + 5] == '\0') {
          iVar5 = iVar5 + (-3 - uVar10);
        }
        else if (pcVar6[lVar8 + 6] == '\0') {
          iVar5 = iVar5 + (-2 - uVar10);
        }
        else {
          bVar4 = true;
          if (pcVar6[lVar8 + 7] != '\0') goto LAB_00107686;
          iVar5 = iVar5 + ~uVar10;
        }
        unaff_RBP = (char *)(ulong)(uint)(iVar3 + iVar5);
        if (_num <= iVar3 + iVar5) {
          unaff_RBP = (char *)(ulong)(uint)_num;
        }
        bVar4 = false;
      }
LAB_00107686:
      uVar7 = (uint)unaff_RBP;
      pcVar6 = pcVar6 + lVar9;
    } while (bVar4);
  }
  else {
    uVar12 = uVar10;
    if (*src != '\0') {
      pcVar6 = src + 1;
      unaff_RBP = src;
      do {
        if (((int)unaff_RBP + 1U & 7) == 0) goto LAB_0010756b;
        unaff_RBP = unaff_RBP + 1;
        uVar12 = (uint)unaff_RBP;
        cVar1 = *pcVar6;
        pcVar6 = pcVar6 + 1;
      } while (cVar1 != '\0');
    }
    uVar7 = uVar12 - uVar10;
    if (_num <= (int)(uVar12 - uVar10)) {
      uVar7 = _num;
    }
  }
  uVar10 = dst_sz - 1U;
  if ((int)uVar7 < (int)(dst_sz - 1U)) {
    uVar10 = uVar7;
  }
  if (0 < (int)uVar10) {
    memcpy(dst,src,(ulong)uVar10);
  }
  dst[(int)uVar10] = '\0';
  return dst + (int)uVar10;
}

Assistant:

char* sx_strncpy(char* SX_RESTRICT dst, int dst_sz, const char* SX_RESTRICT src, int _num)
{
    sx_assert(dst);
    sx_assert(src);

    const int len = sx__strnlen(src, _num);
    const int32_t max = dst_sz - 1;
    const int32_t num = (len < max ? len : max);
    if (num > 0) {
        sx_memcpy(dst, src, num);
    }
    dst[num] = '\0';

    return &dst[num];
}